

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackFrame.SystemV.cpp
# Opt level: O2

bool __thiscall Js::Amd64StackFrame::Next(Amd64StackFrame *this)

{
  void **ppvVar1;
  
  ppvVar1 = this->frame;
  this->addressOfCodeAddr = ppvVar1 + 1;
  this->codeAddr = ppvVar1[1];
  ppvVar1 = (void **)*ppvVar1;
  this->frame = ppvVar1;
  return ppvVar1 != (void **)0x0;
}

Assistant:

bool
Amd64StackFrame::Next()
{
    this->addressOfCodeAddr = this->GetAddressOfReturnAddress();
    this->codeAddr = this->GetReturnAddress();
    this->frame = (void **)this->frame[0];
    return frame != nullptr;
}